

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceMgr.h
# Opt level: O1

MemoryBuffer * __thiscall llvm::SourceMgr::getMemoryBuffer(SourceMgr *this,uint i)

{
  if ((i != 0) &&
     ((ulong)i <=
      (ulong)(((long)(this->Buffers).
                     super__Vector_base<llvm::SourceMgr::SrcBuffer,_std::allocator<llvm::SourceMgr::SrcBuffer>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->Buffers).
                     super__Vector_base<llvm::SourceMgr::SrcBuffer,_std::allocator<llvm::SourceMgr::SrcBuffer>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555))) {
    return (MemoryBuffer *)
           (tuple<llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>)
           *(tuple<llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_> *)
            &(this->Buffers).
             super__Vector_base<llvm::SourceMgr::SrcBuffer,_std::allocator<llvm::SourceMgr::SrcBuffer>_>
             ._M_impl.super__Vector_impl_data._M_start[i - 1].Buffer._M_t;
  }
  __assert_fail("isValidBufferID(i)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/Support/SourceMgr.h"
                ,0x85,"const MemoryBuffer *llvm::SourceMgr::getMemoryBuffer(unsigned int) const");
}

Assistant:

bool isValidBufferID(unsigned i) const { return i && i <= Buffers.size(); }